

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void idr_set_num(uchar *p,int num)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int num_local;
  uchar *p_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)num;
  iVar3 = SUB164(auVar1 % ZEXT816(0xb640),0);
  *p = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(ulong)(long)iVar3 / 0x510];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar3;
  iVar3 = SUB164(auVar2 % ZEXT816(0x510),0);
  p[1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(ulong)(long)iVar3 / 0x24];
  p[2] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)((ulong)(long)iVar3 % 0x24)];
  return;
}

Assistant:

static void
idr_set_num(unsigned char *p, int num)
{
	static const char xdig[] = {
		'0', '1', '2', '3', '4', '5', '6', '7', '8', '9',
		'A', 'B', 'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J',
		'K', 'L', 'M', 'N', 'O', 'P', 'Q', 'R', 'S', 'T',
		'U', 'V', 'W', 'X', 'Y', 'Z'
	};

	num %= sizeof(xdig) * sizeof(xdig) * sizeof(xdig);
	p[0] = xdig[(num / (sizeof(xdig) * sizeof(xdig)))];
	num %= sizeof(xdig) * sizeof(xdig);
	p[1] = xdig[ (num / sizeof(xdig))];
	num %= sizeof(xdig);
	p[2] = xdig[num];
}